

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_ManSimulateCis(Gia_Man_t *p)

{
  int iVar1;
  word wVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  word *pwVar7;
  
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar6];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) break;
      uVar4 = iVar1 * p->nSimWords;
      if (((int)uVar4 < 0) || (p->vSims->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar7 = p->vSims->pArray + uVar4;
      if (0 < p->nSimWords) {
        lVar5 = 0;
        do {
          wVar2 = Gia_ManRandomW(0);
          pwVar7[lVar5] = wVar2;
          lVar5 = lVar5 + 1;
        } while (lVar5 < p->nSimWords);
        pVVar3 = p->vCis;
      }
      *pwVar7 = *pwVar7 << 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
  }
  p->iPatsPi = 0;
  return;
}

Assistant:

void Cec2_ManSimulateCis( Gia_Man_t * p )
{
    int i, Id;
    Gia_ManForEachCiId( p, Id, i )
        Cec2_ObjSimCi( p, Id );
    p->iPatsPi = 0;
}